

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

void __thiscall
pstore::index::details::internal_node::insert_child
          (internal_node *this,hash_type hash,index_pointer leaf,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents)

{
  uint uVar1;
  ulong uVar2;
  pointer peVar3;
  pointer peVar4;
  array_stack<pstore::index::details::parent_type,_13UL> *this_00;
  index_pointer local_f0;
  parent_type local_e8;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_d8;
  span<pstore::index::details::index_pointer,__1L> local_c8;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_b8;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_a8;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_98;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_88;
  undefined1 local_78 [8];
  span<pstore::index::details::index_pointer,__1L> d_span;
  span<pstore::index::details::index_pointer,__1L> span;
  undefined1 auStack_50 [4];
  uint num_to_move;
  span<pstore::index::details::index_pointer,__1L> children_span;
  uint old_size;
  uint index;
  hash_type bit_pos;
  hash_type hash_index;
  hash_type hash_local;
  internal_node *this_local;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents_local;
  index_pointer leaf_local;
  
  uVar2 = 1L << ((byte)hash & 0x3f);
  this_local = (internal_node *)parents.ptr_;
  parents_local.ptr_ = (array_stack<pstore::index::details::parent_type,_13UL> *)leaf;
  if (uVar2 == 0) {
    assert_failed("bit_pos != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x130);
  }
  if ((this->bitmap_ & uVar2) != 0) {
    assert_failed("(this->bitmap_ & bit_pos) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x133);
  }
  children_span.storage_.data_._4_4_ = bit_count::pop_count(this->bitmap_ & uVar2 - 1);
  children_span.storage_.data_._0_4_ = bit_count::pop_count(this->bitmap_);
  if (0x3f < (uint)children_span.storage_.data_) {
    assert_failed("old_size < hash_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x138);
  }
  if (children_span.storage_.data_._4_4_ <= (uint)children_span.storage_.data_) {
    _auStack_50 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                  gsl::make_span<pstore::index::details::index_pointer>(this->children_,0x40);
    uVar1 = (uint)children_span.storage_.data_ - children_span.storage_.data_._4_4_;
    join_0x00000010_0x00000000_ =
         (storage_type<pstore::gsl::details::extent_type<_1L>_>)
         gsl::span<pstore::index::details::index_pointer,_-1L>::subspan
                   ((span<pstore::index::details::index_pointer,__1L> *)auStack_50,
                    (ulong)children_span.storage_.data_._4_4_,(ulong)uVar1);
    _local_78 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                gsl::span<pstore::index::details::index_pointer,_-1L>::subspan
                          ((span<pstore::index::details::index_pointer,__1L> *)auStack_50,
                           (ulong)(children_span.storage_.data_._4_4_ + 1),(ulong)uVar1);
    local_88 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               gsl::span<pstore::index::details::index_pointer,_-1L>::last
                         ((span<pstore::index::details::index_pointer,__1L> *)local_78,0);
    peVar3 = gsl::span<pstore::index::details::index_pointer,_-1L>::data
                       ((span<pstore::index::details::index_pointer,__1L> *)&local_88);
    local_98 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               gsl::span<pstore::index::details::index_pointer,_-1L>::last
                         ((span<pstore::index::details::index_pointer,__1L> *)auStack_50,0);
    peVar4 = gsl::span<pstore::index::details::index_pointer,_-1L>::data
                       ((span<pstore::index::details::index_pointer,__1L> *)&local_98);
    if (peVar4 < peVar3) {
      assert_failed("d_span.last (0).data () <= children_span.last (0).data ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                    ,0x142);
    }
    std::begin<pstore::gsl::span<pstore::index::details::index_pointer,_1l>>
              ((span<pstore::index::details::index_pointer,__1L> *)&local_a8);
    std::end<pstore::gsl::span<pstore::index::details::index_pointer,_1l>>
              ((span<pstore::index::details::index_pointer,__1L> *)&local_b8);
    std::end<pstore::gsl::span<pstore::index::details::index_pointer,_1l>>(&local_c8);
    std::
    move_backward<pstore::gsl::details::span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_1l>,false>,pstore::gsl::details::span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_1l>,false>>
              (&local_d8,&local_a8,&local_b8);
    this->children_[children_span.storage_.data_._4_4_].addr_.a_ = (value_type)parents_local.ptr_;
    this->bitmap_ = this->bitmap_ | uVar2;
    uVar1 = bit_count::pop_count(this->bitmap_);
    if (uVar1 == (uint)children_span.storage_.data_ + 1) {
      this_00 = gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
                operator->((not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                            *)&this_local);
      index_pointer::index_pointer((index_pointer *)&local_f0.addr_,this);
      parent_type::parent_type(&local_e8,local_f0,(ulong)children_span.storage_.data_._4_4_);
      array_stack<pstore::index::details::parent_type,_13UL>::push(this_00,&local_e8);
      return;
    }
    assert_failed("bit_count::pop_count (this->bitmap_) == old_size + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x14a);
  }
  assert_failed("index <= old_size",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                ,0x139);
}

Assistant:

void internal_node::insert_child (hash_type const hash, index_pointer const leaf,
                                              gsl::not_null<parent_stack *> const parents) {
                auto const hash_index = hash & details::hash_index_mask;
                auto const bit_pos = hash_type{1} << hash_index;
                PSTORE_ASSERT (bit_pos != 0); // guarantee that we didn't shift the bit to oblivion
                // check that this slot is free.
                PSTORE_ASSERT ((this->bitmap_ & bit_pos) ==
                               0); //! OCLINT(PH - bitwise in conditional)

                // Compute the child index by counting the number of 1 bits below bit_pos.
                unsigned const index = bit_count::pop_count (this->bitmap_ & (bit_pos - 1));
                unsigned const old_size = bit_count::pop_count (this->bitmap_);
                PSTORE_ASSERT (old_size < hash_size);
                PSTORE_ASSERT (index <= old_size);

                // Move elements from [index..old_size) to [index+1..old_size+1)
                {
                    auto const children_span = gsl::make_span (&children_[0], hash_size);
                    auto const num_to_move = old_size - index;

                    auto const span = children_span.subspan (index, num_to_move);
                    auto const d_span = children_span.subspan (index + 1, num_to_move);
                    PSTORE_ASSERT (d_span.last (0).data () <= children_span.last (0).data ());

                    std::move_backward (std::begin (span), std::end (span), std::end (d_span));
                }

                children_[index] = leaf;

                this->bitmap_ = this->bitmap_ | bit_pos;
                PSTORE_ASSERT (bit_count::pop_count (this->bitmap_) == old_size + 1);
                parents->push (parent_type{index_pointer{this}, index});
            }